

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCombinedCase::runComputeShader
          (ComputeShaderGeneratedCombinedCase *this)

{
  DrawMethod DVar1;
  int i;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar6;
  int *piVar7;
  byte bVar8;
  int size;
  int size_00;
  int size_01;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  IVec3 dispatchSize;
  IVec3 drawElementsDataBufferDispatchSize;
  IVec3 indexBufferDispatchSize;
  IVec3 commandDispatchSize;
  IVec3 dataBufferDispatchSize;
  Vector<int,_3> res;
  string local_218;
  Vector<int,_3> local_1f8;
  int local_1ec [6];
  uint local_1d4 [3];
  undefined8 local_1c8;
  int local_1c0;
  undefined1 local_1b8 [8];
  undefined4 local_1b0;
  ios_base local_140 [268];
  int local_34;
  int iStack_30;
  uint local_2c;
  long lVar5;
  
  iVar2 = (*((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
  local_1d4[0] = (uint)bVar11;
  if (local_1d4[0] != 0) {
    local_1d4[0] = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
  }
  local_1d4[1] = (uint)bVar11;
  local_1d4[2] = (uint)bVar11;
  bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeData == false;
  if (bVar11) {
    local_1ec[0] = 0;
    local_1ec[1] = 0;
    local_1ec[2] = 0;
    local_34 = 0;
  }
  else {
    local_34 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    local_1ec[1] = local_34 + 1;
    local_1ec[0] = local_34 + 1;
    local_1ec[2] = 1;
  }
  local_1ec[2] = (int)!bVar11;
  bVar12 = (this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS;
  iStack_30 = local_34;
  local_2c = (uint)!bVar11;
  piVar7 = local_1ec;
  if (!bVar12) {
    piVar7 = &local_34;
  }
  lVar6 = 0;
  local_1ec[3] = 0;
  bVar8 = bVar12 & (this->super_ComputeShaderGeneratedCase).m_computeIndices;
  if (bVar8 != 0) {
    local_1ec[3] = (this->super_ComputeShaderGeneratedCase).m_gridSize;
  }
  local_1ec[4] = local_1ec[3];
  local_1ec[5] = (uint)bVar8;
  local_1c0 = piVar7[2];
  local_1c8 = *(undefined8 *)piVar7;
  local_1b0 = 0;
  local_1b8 = (undefined1  [8])0x0;
  do {
    iVar2 = *(int *)((long)&local_1c8 + lVar6 * 4);
    if (iVar2 < local_1ec[lVar6 + 6]) {
      iVar2 = local_1ec[lVar6 + 6];
    }
    *(int *)(local_1b8 + lVar6 * 4) = iVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_1f8.m_data[2] = 0;
  local_1f8.m_data[0] = 0;
  local_1f8.m_data[1] = 0;
  lVar6 = 0;
  do {
    iVar2 = local_1ec[lVar6 + 3];
    if (local_1ec[lVar6 + 3] < *(int *)(local_1b8 + lVar6 * 4)) {
      iVar2 = *(int *)(local_1b8 + lVar6 * 4);
    }
    local_1f8.m_data[lVar6] = iVar2;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  (**(code **)(lVar5 + 0x1680))((this->m_computeProgram->m_program).m_program);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"use compute shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x665);
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    uVar9 = (this->super_ComputeShaderGeneratedCase).m_numDrawCmds *
            (this->super_ComputeShaderGeneratedCase).m_commandSize;
    local_1b8 = (undefined1  [8])
                ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Binding command buffer to binding point ",0x28);
    std::ostream::operator<<((ostringstream *)&local_1b0,0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    (**(code **)(lVar5 + 0x48))(0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_cmdBufferID);
    local_1b8 = (undefined1  [8])
                ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Allocating memory for command buffer, size ",0x2b);
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_218,(_anonymous_namespace_ *)(ulong)uVar9,size);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(int)uVar9,0,0x88e8);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    DVar1 = (this->super_ComputeShaderGeneratedCase).m_drawMethod;
    iVar2 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    if (DVar1 == DRAWMETHOD_DRAWELEMENTS) {
      iVar4 = (iVar2 + 1) * (iVar2 + 1) * 4;
    }
    else {
      iVar4 = 0;
      if (DVar1 == DRAWMETHOD_DRAWARRAYS) {
        iVar4 = iVar2 * iVar2 * 0xc;
      }
    }
    bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
    local_1b8 = (undefined1  [8])
                ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Binding data buffer to binding point ",0x25);
    std::ostream::operator<<((ostringstream *)&local_1b0,(uint)bVar11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    (**(code **)(lVar5 + 0x48))
              (0x90d2,bVar11,(this->super_ComputeShaderGeneratedCase).m_dataBufferID);
    local_1b8 = (undefined1  [8])
                ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Allocating memory for data buffer, size ",0x28);
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_218,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 4),size_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(iVar4 << 4),0,0x88e8);
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) {
    bVar11 = (this->super_ComputeShaderGeneratedCase).m_computeCmd;
    bVar12 = (this->super_ComputeShaderGeneratedCase).m_computeData;
    if (((bVar11 != true) || (uVar9 = 2, (bVar12 & 1U) == 0)) &&
       (uVar9 = (uint)bVar12, bVar11 != false)) {
      uVar9 = 1;
    }
    iVar2 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    uVar10 = iVar2 * iVar2 * 0x18;
    if ((this->super_ComputeShaderGeneratedCase).m_drawMethod != DRAWMETHOD_DRAWELEMENTS) {
      uVar10 = 0;
    }
    local_1b8 = (undefined1  [8])
                ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Binding index buffer to binding point ",0x26);
    std::ostream::operator<<((ostringstream *)&local_1b0,uVar9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    (**(code **)(lVar5 + 0x48))
              (0x90d2,uVar9,(this->super_ComputeShaderGeneratedCase).m_indexBufferID);
    local_1b8 = (undefined1  [8])
                ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Allocating memory for index buffer, size ",0x29);
    Functional::(anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_218,(_anonymous_namespace_ *)(ulong)uVar10,size_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    (**(code **)(lVar5 + 0x150))(0x90d2,(long)(int)uVar10,0,0x88e8);
  }
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"setup buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x68d);
  local_1b8 = (undefined1  [8])
              ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.super_TestNode
              .m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,"Dispatching compute, size = ",0x1c);
  tcu::operator<<((ostream *)&local_1b0,&local_1f8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar5 + 0x528))
            (local_1f8.m_data._0_8_ & 0xffffffff,local_1f8.m_data[1],local_1f8.m_data[2]);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"calculate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x694);
  return;
}

Assistant:

void ComputeShaderGeneratedCombinedCase::runComputeShader (void)
{
	const glw::Functions&	gl									= m_context.getRenderContext().getFunctions();
	const bool				indexed								= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS);
	const tcu::IVec3		nullSize							(0, 0, 0);
	const tcu::IVec3		commandDispatchSize					= (m_computeCmd)				? (tcu::IVec3(m_numDrawCmds, 1, 1))				: (nullSize);
	const tcu::IVec3		drawElementsDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize+1, m_gridSize+1, 1))	: (nullSize);
	const tcu::IVec3		drawArraysDataBufferDispatchSize	= (m_computeData)				? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);
	const tcu::IVec3		indexBufferDispatchSize				= (m_computeIndices && indexed)	? (tcu::IVec3(m_gridSize,   m_gridSize,   1))	: (nullSize);

	const tcu::IVec3		dataBufferDispatchSize				= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS) ? (drawElementsDataBufferDispatchSize) : (drawArraysDataBufferDispatchSize);
	const tcu::IVec3		dispatchSize						= tcu::max(tcu::max(commandDispatchSize, dataBufferDispatchSize), indexBufferDispatchSize);

	gl.useProgram(m_computeProgram->getProgram());
	glu::checkError(gl.getError(), "use compute shader", __FILE__, __LINE__);

	// setup buffers

	if (m_computeCmd)
	{
		const int			bindingPoint	= 0;
		const int			bufferSize		= m_commandSize * m_numDrawCmds;

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding command buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_cmdBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for command buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeData)
	{
		const int			bindingPoint	= (m_computeCmd) ? (1) : (0);
		const int			bufferSize		= (int)(calcDrawBufferSize()*sizeof(tcu::Vec4));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding data buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_dataBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for data buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	if (m_computeIndices)
	{
		const int			bindingPoint	= (m_computeCmd && m_computeData) ? (2) : (m_computeCmd || m_computeData) ? (1) : (0);
		const int			bufferSize		= (int)(calcIndexBufferSize()*sizeof(deUint32));

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding index buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_indexBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for index buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);
	}

	glu::checkError(gl.getError(), "setup buffers", __FILE__, __LINE__);

	// calculate

	m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching compute, size = " << dispatchSize << tcu::TestLog::EndMessage;
	gl.dispatchCompute(dispatchSize.x(), dispatchSize.y(), dispatchSize.z());

	glu::checkError(gl.getError(), "calculate", __FILE__, __LINE__);
}